

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::LookupLinkItems
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items)

{
  const_iterator this_00;
  bool bVar1;
  __type _Var2;
  reference item;
  string *__rhs;
  ulong uVar3;
  cmTarget *t;
  cmLinkItem local_88;
  undefined4 local_60;
  undefined1 local_50 [8];
  string name;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator i;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmTarget *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)items;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(names);
  while( true ) {
    name.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(names);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&name.field_2 + 8));
    if (!bVar1) break;
    item = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
    CheckCMP0004((string *)local_50,this,item);
    __rhs = GetName_abi_cxx11_(this);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,__rhs);
    if ((_Var2) || (uVar3 = std::__cxx11::string::empty(), this_00 = i, (uVar3 & 1) != 0)) {
      local_60 = 4;
    }
    else {
      t = FindTargetToLink(this,(string *)local_50);
      cmLinkItem::cmLinkItem(&local_88,(std_string *)local_50,t);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_00._M_current,&local_88);
      cmLinkItem::~cmLinkItem(&local_88);
      local_60 = 0;
    }
    std::__cxx11::string::~string((string *)local_50);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void cmTarget::LookupLinkItems(std::vector<std::string> const& names,
                               std::vector<cmLinkItem>& items) const
{
  for(std::vector<std::string>::const_iterator i = names.begin();
      i != names.end(); ++i)
    {
    std::string name = this->CheckCMP0004(*i);
    if(name == this->GetName() || name.empty())
      {
      continue;
      }
    items.push_back(cmLinkItem(name, this->FindTargetToLink(name)));
    }
}